

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  string *psVar1;
  string pfile;
  string home;
  string local_50;
  string local_30;
  
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::__cxx11::string::string((string *)&local_30,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_30);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  CheckRuleHashes(this,&local_50,&local_30);
  WriteRuleHashes(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = home;
  pfile += "/CMakeFiles";
  pfile += "/CMakeRuleHashes.txt";
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
#endif
}